

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O2

bool __thiscall lume::Mesh::has(Mesh *this,GrobSet grobSet)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = grobSet.m_offset + 3;
  uVar1 = (ulong)*(uint *)(impl::GROB_SET_DESCS + (ulong)(grobSet.m_offset + 2) * 4);
  do {
    uVar4 = uVar1;
    if (uVar4 == 0) break;
    bVar2 = has(this,*(grob_t *)(impl::GROB_SET_DESCS + (ulong)uVar3 * 4));
    uVar3 = uVar3 + 1;
    uVar1 = uVar4 - 1;
  } while (!bVar2);
  return uVar4 != 0;
}

Assistant:

bool has (const GrobSet grobSet) const
	{
		for (auto grobType : grobSet) {
			if (has (grobType))
				return true;
		}
		return false;
	}